

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Z80Implementation.hpp
# Opt level: O0

void __thiscall
CPU::Z80::Processor<AmstradCPC::ConcreteMachine<true>,_false,_true>::assemble_page
          (Processor<AmstradCPC::ConcreteMachine<true>,_false,_true> *this,InstructionPage *target,
          InstructionTable *table,bool add_offsets)

{
  bool bVar1;
  IntType IVar2;
  reference puVar3;
  reference pvVar4;
  reference ppMVar5;
  size_t index;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  size_t c;
  size_t t;
  ulong local_888;
  size_t c_2;
  size_t destination;
  undefined1 local_860 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> operation_indices;
  size_t length;
  int c_1;
  size_t lengths [256];
  size_type local_30;
  size_t number_of_micro_ops;
  bool add_offsets_local;
  InstructionTable *table_local;
  InstructionPage *target_local;
  Processor<AmstradCPC::ConcreteMachine<true>,_false,_true> *this_local;
  
  local_30 = 0;
  for (length._4_4_ = 0; length._4_4_ < 0x100; length._4_4_ = length._4_4_ + 1) {
    operation_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while (bVar1 = ProcessorStorage::is_terminal
                             ((*table)[length._4_4_]
                              [(long)operation_indices.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage].type),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      operation_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)operation_indices.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 1);
    }
    operation_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)operation_indices.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1);
    *(pointer *)(&stack0xfffffffffffff7c8 + (long)length._4_4_ * 8) =
         operation_indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    local_30 = (long)operation_indices.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + local_30;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860);
  std::
  vector<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
  ::reserve(&target->all_operations,local_30);
  destination = 0;
  std::
  vector<CPU::Z80::ProcessorStorage::MicroOp_*,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp_*>_>
  ::resize(&target->instructions,0x100,(value_type *)&destination);
  c_2 = 0;
  for (local_888 = 0; local_888 < 0x100; local_888 = local_888 + 1) {
    t = std::
        vector<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
        ::size(&target->all_operations);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860,&t);
    c = 0;
    while (c < *(ulong *)(&stack0xfffffffffffff7c8 + local_888 * 8)) {
      if (((*table)[local_888][c].type == BusOperation) &&
         (IVar2 = WrappedInt<HalfCycles>::as_integral
                            (&(*table)[local_888][c].machine_cycle.length.
                              super_WrappedInt<HalfCycles>), IVar2 == 0)) {
        c = c + 1;
      }
      else {
        if (((*table)[local_888][c].type == IndexedPlaceHolder) && (c = c + 1, !add_offsets)) {
          for (; (*table)[local_888][c].type != CalculateIndexAddress; c = c + 1) {
          }
          c = c + 1;
        }
        std::
        vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
        ::emplace_back<CPU::Z80::ProcessorStorage::MicroOp&>
                  ((vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
                    *)&target->all_operations,(*table)[local_888] + c);
        c_2 = c_2 + 1;
        c = c + 1;
      }
    }
  }
  __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860);
  index = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&index), bVar1) {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end2);
    pvVar4 = std::
             vector<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
             ::operator[](&target->all_operations,*puVar3);
    ppMVar5 = std::
              vector<CPU::Z80::ProcessorStorage::MicroOp_*,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp_*>_>
              ::operator[](&target->instructions,(size_type)__range2);
    *ppMVar5 = pvVar4;
    __range2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(__range2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end2);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_860);
  return;
}

Assistant:

void Processor <T, uses_bus_request, uses_wait_line>
				::assemble_page(InstructionPage &target, InstructionTable &table, bool add_offsets) {
	std::size_t number_of_micro_ops = 0;
	std::size_t lengths[256];

	// Count number of micro-ops required.
	for(int c = 0; c < 256; c++) {
		std::size_t length = 0;
		while(!is_terminal(table[c][length].type)) length++;
		length++;
		lengths[c] = length;
		number_of_micro_ops += length;
	}

	// Allocate a landing area.
	std::vector<std::size_t> operation_indices;
	target.all_operations.reserve(number_of_micro_ops);
	target.instructions.resize(256, nullptr);

	// Copy in all programs, recording where they go.
	std::size_t destination = 0;
	for(std::size_t c = 0; c < 256; c++) {
		operation_indices.push_back(target.all_operations.size());
		for(std::size_t t = 0; t < lengths[c];) {
			// Skip zero-length bus cycles.
			if(table[c][t].type == MicroOp::BusOperation && table[c][t].machine_cycle.length.as_integral() == 0) {
				t++;
				continue;
			}

			// Skip optional waits if this instance doesn't use the wait line.
			if(table[c][t].machine_cycle.was_requested && !uses_wait_line) {
				t++;
				continue;
			}

			// If an index placeholder is hit then drop it, and if offsets aren't being added,
			// then also drop the indexing that follows, which is assumed to be everything
			// up to and including the next ::CalculateIndexAddress. Coupled to the INDEX() macro.
			if(table[c][t].type == MicroOp::IndexedPlaceHolder) {
				t++;
				if(!add_offsets) {
					while(table[c][t].type != MicroOp::CalculateIndexAddress) t++;
					t++;
				}
			}
			target.all_operations.emplace_back(table[c][t]);
			destination++;
			t++;
		}
	}

	// Since the vector won't change again, it's now safe to set pointers.
	std::size_t c = 0;
	for(std::size_t index : operation_indices) {
		target.instructions[c] = &target.all_operations[index];
		c++;
	}
}